

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rect.h
# Opt level: O3

bool __thiscall irr::core::rect<int>::constrainTo(rect<int> *this,rect<int> *other)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar1 = (other->LowerRightCorner).X;
  iVar6 = (this->UpperLeftCorner).X;
  iVar3 = (this->LowerRightCorner).X;
  if (iVar3 - iVar6 <= iVar1 - (other->UpperLeftCorner).X) {
    iVar2 = (other->LowerRightCorner).Y;
    iVar5 = (this->UpperLeftCorner).Y;
    iVar4 = (this->LowerRightCorner).Y;
    if (iVar4 - iVar5 <= iVar2 - (other->UpperLeftCorner).Y) {
      if (iVar1 - iVar3 < 0) {
        (this->LowerRightCorner).X = iVar1;
        iVar6 = iVar6 + (iVar1 - iVar3);
        (this->UpperLeftCorner).X = iVar6;
        iVar3 = iVar1;
      }
      if (iVar2 - iVar4 < 0) {
        (this->LowerRightCorner).Y = iVar2;
        iVar5 = iVar5 + (iVar2 - iVar4);
        (this->UpperLeftCorner).Y = iVar5;
        iVar4 = iVar2;
      }
      iVar1 = (other->UpperLeftCorner).X;
      iVar6 = iVar6 - iVar1;
      if (iVar6 < 0) {
        (this->UpperLeftCorner).X = iVar1;
        (this->LowerRightCorner).X = iVar3 - iVar6;
      }
      iVar1 = (other->UpperLeftCorner).Y;
      iVar5 = iVar5 - iVar1;
      if (-1 < iVar5) {
        return true;
      }
      (this->UpperLeftCorner).Y = iVar1;
      (this->LowerRightCorner).Y = iVar4 - iVar5;
      return true;
    }
  }
  return false;
}

Assistant:

T getWidth() const
	{
		return LowerRightCorner.X - UpperLeftCorner.X;
	}